

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_get_subject_key_id(uchar **p,uchar *end,mbedtls_x509_buf *subject_key_id)

{
  size_t local_38;
  size_t len;
  mbedtls_x509_buf *pmStack_28;
  int ret;
  mbedtls_x509_buf *subject_key_id_local;
  uchar *end_local;
  uchar **p_local;
  
  len._4_4_ = 0xffffff92;
  local_38 = 0;
  pmStack_28 = subject_key_id;
  subject_key_id_local = (mbedtls_x509_buf *)end;
  end_local = (uchar *)p;
  len._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,4);
  if (len._4_4_ == 0) {
    pmStack_28->len = local_38;
    pmStack_28->tag = 4;
    pmStack_28->p = *(uchar **)end_local;
    *(size_t *)end_local = local_38 + *(long *)end_local;
    if (*(mbedtls_x509_buf **)end_local == subject_key_id_local) {
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ =
           mbedtls_error_add(-0x2500,-0x66,
                             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                             ,0x25b);
    }
  }
  else {
    p_local._4_4_ =
         mbedtls_error_add(-0x2500,len._4_4_,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/x509_crt.c"
                           ,0x251);
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_subject_key_id(unsigned char **p,
                                   const unsigned char *end,
                                   mbedtls_x509_buf *subject_key_id)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0u;

    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_OCTET_STRING)) != 0) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS, ret);
    }

    subject_key_id->len = len;
    subject_key_id->tag = MBEDTLS_ASN1_OCTET_STRING;
    subject_key_id->p = *p;
    *p += len;

    if (*p != end) {
        return MBEDTLS_ERROR_ADD(MBEDTLS_ERR_X509_INVALID_EXTENSIONS,
                                 MBEDTLS_ERR_ASN1_LENGTH_MISMATCH);
    }

    return 0;
}